

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotprecv.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  __u32 force_rx_stmin;
  sockaddr_can addr;
  uchar msg [67000];
  undefined4 uStack_10614;
  ulong uStack_10610;
  ulong uStack_10608;
  sockaddr sStack_10600;
  byte abStack_105e8 [67000];
  
  uStack_10614 = 0;
  sStack_10600.sa_data[6] = -1;
  sStack_10600.sa_data[7] = -1;
  sStack_10600.sa_data[8] = -1;
  sStack_10600.sa_data[9] = -1;
  sStack_10600.sa_data[10] = -1;
  sStack_10600.sa_data[0xb] = -1;
  sStack_10600.sa_data[0xc] = -1;
  sStack_10600.sa_data[0xd] = -1;
  uStack_10608 = 0xffffffff;
  uStack_10610 = 0xffffffff;
  bVar3 = false;
switchD_001016a1_caseD_6c:
  do {
    bVar2 = bVar3;
    iVar4 = getopt(argc,argv,"s:d:x:p:P:b:m:w:f:lFL:?");
    bVar3 = bVar2;
    if (0x4f < iVar4) {
      bVar3 = true;
      switch(iVar4) {
      case 0x62:
        uVar7 = strtoul(_optarg,(char **)0x0,0x10);
        main::fcopts.bs = (__u8)uVar7;
        bVar3 = bVar2;
        break;
      case 99:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
        goto switchD_00101613_caseD_71;
      case 100:
        uStack_10608 = strtoul(_optarg,(char **)0x0,0x10);
        sStack_10600.sa_data._6_4_ = SUB84(uStack_10608,0);
        sVar6 = strlen(_optarg);
        bVar3 = bVar2;
        if (7 < sVar6) {
          sStack_10600.sa_data._6_4_ = (uint)uStack_10608 | 0x80000000;
          uStack_10608 = (ulong)(uint)sStack_10600.sa_data._6_4_;
        }
        break;
      case 0x66:
        main::opts.flags = main::opts.flags | 0x100;
        uVar7 = strtoul(_optarg,(char **)0x0,10);
        uStack_10614 = (undefined4)uVar7;
        bVar3 = bVar2;
        break;
      case 0x6c:
        break;
      case 0x6d:
        uVar7 = strtoul(_optarg,(char **)0x0,0x10);
        main::fcopts.stmin = (__u8)uVar7;
        bVar3 = bVar2;
        break;
      default:
        switch(iVar4) {
        case 0x70:
          iVar4 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c5,0x1040c6);
          if (iVar4 == 2) {
            main::opts.flags = main::opts.flags | 0xc;
            bVar3 = bVar2;
          }
          else if (iVar4 == 1) {
            main::opts.flags = main::opts.flags | 4;
            bVar3 = bVar2;
          }
          else {
            iVar4 = __isoc99_sscanf(_optarg,":%hhx",0x1040c6);
            if (iVar4 != 1) goto LAB_00101a3f;
            main::opts.flags = main::opts.flags | 8;
            bVar3 = bVar2;
          }
          break;
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x76:
          goto switchD_00101613_caseD_71;
        case 0x73:
          uStack_10610 = strtoul(_optarg,(char **)0x0,0x10);
          sStack_10600.sa_data._10_4_ = SUB84(uStack_10610,0);
          sVar6 = strlen(_optarg);
          bVar3 = bVar2;
          if (7 < sVar6) {
            sStack_10600.sa_data._10_4_ = (uint)uStack_10610 | 0x80000000;
            uStack_10610 = (ulong)(uint)sStack_10600.sa_data._10_4_;
          }
          break;
        case 0x77:
          uVar7 = strtoul(_optarg,(char **)0x0,0x10);
          main::fcopts.wftmax = (__u8)uVar7;
          bVar3 = bVar2;
          break;
        case 0x78:
          iVar4 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c4,0x1040c7);
          uVar8 = 2;
          if (iVar4 != 1) {
            if (iVar4 != 2) goto LAB_00101a2c;
            uVar8 = 0x202;
          }
          main::opts.flags = main::opts.flags | uVar8;
          bVar3 = bVar2;
          break;
        default:
          if (iVar4 != 0x50) goto switchD_00101613_caseD_71;
          cVar1 = *_optarg;
          if (cVar1 == 'a') {
            main::opts.flags = main::opts.flags | 0x30;
            bVar3 = bVar2;
          }
          else if (cVar1 == 'c') {
            main::opts.flags = main::opts.flags | 0x20;
            bVar3 = bVar2;
          }
          else {
            if (cVar1 != 'l') goto LAB_00101a34;
            main::opts.flags = main::opts.flags | 0x10;
            bVar3 = bVar2;
          }
        }
      }
      goto switchD_001016a1_caseD_6c;
    }
    if (iVar4 < 0x4c) {
      if (iVar4 != 0x46) {
        if (iVar4 == -1) {
          if (((argc - _optind != 1) || ((int)uStack_10610 == -1)) || ((int)uStack_10608 == -1))
          goto LAB_00101a47;
          iVar4 = socket(0x1d,2,6);
          if (iVar4 < 0) goto LAB_00101a4f;
          setsockopt(iVar4,0x6a,1,&main::opts,0xc);
          setsockopt(iVar4,0x6a,2,&main::fcopts,3);
          if ((main::llopts.tx_dl != '\0') &&
             (iVar5 = setsockopt(iVar4,0x6a,5,&main::llopts,3), iVar5 < 0)) goto LAB_00101a60;
          if ((main::opts.flags & 0x100) != 0) {
            setsockopt(iVar4,0x6a,4,&uStack_10614,4);
          }
          sStack_10600.sa_family = 0x1d;
          sStack_10600.sa_data._2_4_ = if_nametoindex(argv[_optind]);
          if (sStack_10600.sa_data._2_4_ == 0) goto LAB_00101a54;
          iVar5 = bind(iVar4,&sStack_10600,0x18);
          if (-1 < iVar5) {
            do {
              uVar7 = read(iVar4,abStack_105e8,67000);
              if ((int)uVar7 - 1U < 66999) {
                uVar9 = 0;
                do {
                  printf("%02X ",(ulong)abStack_105e8[uVar9]);
                  uVar9 = uVar9 + 1;
                } while ((uVar7 & 0xffffffff) != uVar9);
              }
              putchar(10);
            } while (bVar2);
            close(iVar4);
            return 0;
          }
          goto LAB_00101a59;
        }
        if (iVar4 != 0x3f) goto switchD_00101613_caseD_71;
        main_cold_1();
        goto LAB_00101a1a;
      }
      main::opts.flags = main::opts.flags | 0x2000;
    }
    else {
      if (iVar4 != 0x4c) goto switchD_00101613_caseD_71;
      iVar4 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040cc,0x1040cd);
      if (iVar4 != 3) {
LAB_00101a1a:
        main_cold_2();
switchD_00101613_caseD_71:
        main_cold_11();
LAB_00101a2c:
        main_cold_5();
LAB_00101a34:
        main_cold_3();
LAB_00101a3f:
        main_cold_4();
LAB_00101a47:
        main_cold_10();
LAB_00101a4f:
        main_cold_9();
LAB_00101a54:
        main_cold_8();
LAB_00101a59:
        main_cold_7();
LAB_00101a60:
        main_cold_6();
        halt_baddata();
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_fc_options fcopts;
    static struct can_isotp_ll_options llopts;
    int opt, i;
    extern int optind, opterr, optopt;
    __u32 force_rx_stmin = 0;
    int loop = 0;

    unsigned char msg[BUFSIZE];
    int nbytes;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:b:m:w:f:lFL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'b':
		    fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'm':
		    fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'w':
		    fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_RXSTMIN;
		    force_rx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'l':
		    loop = 1;
		    break;

	    case 'F':
		    opts.flags |= CAN_ISOTP_DYN_FC_PARMS;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	(addr.can_addr.tp.rx_id == NO_CAN_ID)) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }
  
    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_RXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RX_STMIN, &force_rx_stmin, sizeof(force_rx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    do {
	    nbytes = read(s, msg, BUFSIZE);
	    if (nbytes > 0 && nbytes < BUFSIZE)
		    for (i=0; i < nbytes; i++)
			    printf("%02X ", msg[i]);
	    printf("\n");
    } while (loop);

    close(s);

    return 0;
}